

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locks.cc
# Opt level: O2

int __thiscall locks::checkList(locks *this,int seed)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  if ((long)this->numberOfKeys < 1) {
    this->keyList[0] = seed;
    this->keyIndex = 1;
    this->numberOfKeys = 1;
  }
  else {
    lVar3 = 0;
    do {
      if (this->numberOfKeys == lVar3) {
        this->keyList[this->keyIndex] = seed;
        iVar2 = this->keyIndex + 1;
        iVar4 = 0;
        if (iVar2 != 1000) {
          iVar4 = iVar2;
        }
        this->keyIndex = iVar4;
        if (999 < this->numberOfKeys) {
          return 1;
        }
        this->numberOfKeys = this->numberOfKeys + 1;
        return 1;
      }
      piVar1 = this->keyList + lVar3;
      lVar3 = lVar3 + 1;
    } while (*piVar1 != seed);
  }
  this->lastLockMatchedIndex = -1;
  return 2;
}

Assistant:

int locks::checkList(int seed) {
  bool found = false;
  int returnCode = 1;  // it was good coming in by default
  if (numberOfKeys > 0) {
    for (int index = 0; index < numberOfKeys; index++) {
      if (seed == keyList[index]) {
        found = true;  // this is a recent repeat
        if (debug) {
          fprintf(stdout, "found %8.8x\n", seed);
        }
        break;
      }
    }
    if (!found) {  // put this key in the list
      if (debug) {
        fprintf(stdout, "Putting seed (%8.8x) into list\n", seed);
      }
      keyList[keyIndex] = seed;
      keyIndex++;
      if (keyIndex == OLD_KEY_LIST_SIZE) {
        keyIndex = 0;
      }
      if (numberOfKeys < OLD_KEY_LIST_SIZE) {
        numberOfKeys++;
      }
    } else {  // we have seen this before
      returnCode = 2;
      lastLockMatchedIndex = -1;  // say we didn't match
    }
  } else {
    if (debug) {
      fprintf(stdout, "First time forced failure with seed %8.8x\n", seed);
    }
    returnCode = 2;  // always fail the first time
    keyList[0] = seed;
    keyIndex = 1;
    numberOfKeys = 1;
    lastLockMatchedIndex = -1;  // say we didn't match
  }
  return returnCode;
}